

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O2

void __thiscall spdlog::async_logger::sink_it_(async_logger *this,log_msg *msg)

{
  shared_ptr<spdlog::details::thread_pool> pool_ptr;
  async_logger_ptr aStack_58;
  __shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2> local_48;
  string local_38;
  
  std::__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&this->thread_pool_);
  if (local_48._M_ptr == (thread_pool *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"async log: thread pool doesn\'t exist anymore",
               (allocator<char> *)&aStack_58);
    throw_spdlog_ex(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<spdlog::async_logger,void>
              ((__shared_ptr<spdlog::async_logger,(__gnu_cxx::_Lock_policy)2> *)&aStack_58,
               (__weak_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<spdlog::async_logger>);
    details::thread_pool::post_log(local_48._M_ptr,&aStack_58,msg,this->overflow_policy_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&aStack_58.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return;
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::sink_it_(const details::log_msg &msg)
{
    if (auto pool_ptr = thread_pool_.lock())
    {
        pool_ptr->post_log(shared_from_this(), msg, overflow_policy_);
    }
    else
    {
        throw_spdlog_ex("async log: thread pool doesn't exist anymore");
    }
}